

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_odc.c
# Opt level: O0

void test_read_format_cpio_odc(void)

{
  archive *a_00;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive *a;
  archive_entry *ae;
  void *in_stack_00000020;
  archive *in_stack_ffffffffffffffe8;
  archive *a_01;
  wchar_t in_stack_fffffffffffffff8;
  wchar_t in_stack_fffffffffffffffc;
  
  a_00 = archive_read_new();
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_support_filter_all(in_stack_ffffffffffffffe8);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_support_format_all(in_stack_ffffffffffffffe8);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_open_memory(a_00,in_stack_ffffffffffffffe8,0x1770d7);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_00,in_stack_ffffffffffffffe8);
  archive_read_next_header(a_00,(archive_entry **)in_stack_ffffffffffffffe8);
  a_01 = a_00;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_00,
                      (longlong)a_00,(char *)0x177140,in_stack_00000020);
  archive_filter_code(a_01,(int)((ulong)a_00 >> 0x20));
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_01,a_00);
  archive_format(a_01);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)a_01,a_00);
  archive_entry_is_encrypted
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_01,0,
                      (char *)0x1771e1,in_stack_00000020);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_01,
                      (longlong)a_01,(char *)0x17721d,in_stack_00000020);
  archive_read_close((archive *)0x177227);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_01,
                      (longlong)a_01,(char *)0x177256,in_stack_00000020);
  archive_read_free((archive *)0x177260);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_01,0,
                      (char *)0x17728e,in_stack_00000020);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_odc)
{
	struct archive_entry *ae;
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertA(archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE);
	assertA(archive_format(a) == ARCHIVE_FORMAT_CPIO_POSIX);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}